

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_register.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  undefined1 local_70 [8];
  array<wchar_t,_3UL> expected_2;
  type tt_2;
  attribute_set<xll::tag::cluster_safe> attrs_2;
  array<wchar_t,_3UL> expected_1;
  type tt_1;
  attribute_set<xll::tag::volatile_> attrs_1;
  array<wchar_t,_3UL> expected;
  type tt;
  attribute_set<xll::tag::thread_safe> attrs;
  
  stack0xffffffffffffffe0 = 0x580000003e;
  stack0xffffffffffffffd0 = 0x580000003e;
  expected._M_elems[0] = L'$';
  bVar1 = std::operator==((array<wchar_t,_3UL> *)(expected._M_elems + 2),
                          (array<wchar_t,_3UL> *)(tt_1._M_elems + 2));
  boost::detail::test_impl
            ("tt == expected",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_register.cpp"
             ,0x41,"int main()",bVar1);
  tt_1._M_elems[1]._3_1_ = 0;
  stack0xffffffffffffffc0 = 0x5100000043;
  tt_1._M_elems[0] = L'!';
  stack0xffffffffffffffb0 = 0x5100000043;
  expected_1._M_elems[0] = L'!';
  bVar1 = std::operator==((array<wchar_t,_3UL> *)(expected_1._M_elems + 2),
                          (array<wchar_t,_3UL> *)(tt_2._M_elems + 2));
  boost::detail::test_impl
            ("tt == expected",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_register.cpp"
             ,0x47,"int main()",bVar1);
  tt_2._M_elems[1]._3_1_ = 0;
  stack0xffffffffffffffa0 = 0x5100000043;
  tt_2._M_elems[0] = L'&';
  local_70._0_4_ = L'C';
  local_70._4_4_ = L'Q';
  expected_2._M_elems[0] = L'&';
  bVar1 = std::operator==((array<wchar_t,_3UL> *)(expected_2._M_elems + 2),
                          (array<wchar_t,_3UL> *)local_70);
  boost::detail::test_impl
            ("tt == expected",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_register.cpp"
             ,0x4d,"int main()",(bool)(-bVar1 & 1));
  iVar2 = boost::report_errors();
  return iVar2;
}

Assistant:

int main()
{
    {
        // expect static assertion failure: macro sheet equivalent functions cannot be thread-safe
        //constexpr auto attrs = attribute_set<tag::thread_safe, tag::macro_sheet_equivalent>();
        //constexpr auto tt = detail::type_text(func1, attrs);
    }
    {
        // expect static assertion failure: macro sheet equivalent functions cannot be cluster-safe
        //constexpr auto attrs = attribute_set<tag::cluster_safe, tag::macro_sheet_equivalent>();
        //constexpr auto tt = detail::type_text(func1, attrs);
    }
    {
        // expect static assertion failure: multiple async handles in argument list
        //constexpr auto tt = detail::type_text(error1, attribute_set<>());
    }
    {
        // expect static assertion failure: async functions must have void return type
        //constexpr auto tt = detail::type_text(error2, attribute_set<>());
    }
    {
        // expect static assertion failure: async functions cannot be cluster-safe
        //constexpr auto attrs = attribute_set<tag::cluster_safe>();
        //constexpr auto tt = detail::type_text(async1, attrs);
    }
    {
        constexpr auto attrs = attribute_set<tag::thread_safe>();
        constexpr auto tt = detail::type_text(async1, attrs);
        constexpr std::array<wchar_t, 3> expected{{ L'>', L'X', L'$' }};
        BOOST_TEST(tt == expected);
    }
    {
        constexpr auto attrs = attribute_set<tag::volatile_>();
        constexpr auto tt = detail::type_text(func1, attrs);
        constexpr std::array<wchar_t, 3> expected{{ L'C', L'Q', L'!' }};
        BOOST_TEST(tt == expected);
    }
    {
        constexpr auto attrs = attribute_set<tag::cluster_safe>();
        constexpr auto tt = detail::type_text(func1, attrs);
        constexpr std::array<wchar_t, 3> expected{{ L'C', L'Q', L'&' }};
        BOOST_TEST(tt == expected);
    }

    return boost::report_errors();
}